

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::EOR_AB(CPU *this)

{
  byte bVar1;
  byte bVar2;
  uint16_t address;
  byte bVar3;
  
  this->cycles = 4;
  address = GetWord(this);
  bVar2 = ReadByte(this,address);
  bVar1 = this->A;
  bVar3 = bVar1 ^ bVar2;
  this->A = bVar3;
  (this->field_6).ps = bVar3 & 0x80 | (bVar1 == bVar2) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::EOR_AB()
{
    cycles = 4;
    A ^= ReadByte(GetWord());
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}